

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_storage.cpp
# Opt level: O2

RowGroupCollection * __thiscall
duckdb::LocalTableStorage::GetOptimisticCollection
          (LocalTableStorage *this,PhysicalIndex collection_index)

{
  reference this_00;
  type pRVar1;
  
  ::std::mutex::lock(&this->collections_lock);
  this_00 = vector<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>,_true>
            ::get<true>(&this->optimistic_collections,collection_index.index);
  pRVar1 = unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>
           ::operator*(this_00);
  pthread_mutex_unlock((pthread_mutex_t *)&this->collections_lock);
  return pRVar1;
}

Assistant:

RowGroupCollection &LocalTableStorage::GetOptimisticCollection(const PhysicalIndex collection_index) {
	lock_guard<mutex> l(collections_lock);
	auto &collection = optimistic_collections[collection_index.index];
	return *collection;
}